

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionTaperedTimoshenkoFPM.cpp
# Opt level: O3

ChMatrixNM<double,_6,_6> * __thiscall
chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM::GetRlawAtPoint
          (ChMatrixNM<double,_6,_6> *__return_storage_ptr__,
          ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM *this,double eta)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  Index outer;
  undefined8 uVar32;
  undefined1 (*pauVar33) [16];
  long lVar34;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  double *pdVar35;
  undefined1 auVar44 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  ulong uVar50;
  double extraout_XMM0_Qa;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  DampingCoefficients rdamping_coeff_B;
  DampingCoefficients rdamping_coeff_A;
  ChMatrixNM<double,_6,_6> mb;
  ChMatrixNM<double,_6,_6> Klaw_point;
  SrcEvaluatorType srcEvaluator;
  double local_450;
  double local_448;
  double local_440;
  double local_438;
  ulong local_428;
  ulong local_420;
  ulong local_418;
  ulong local_410;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  double dStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_3a0;
  undefined8 uStack_398;
  double dStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 uStack_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  double dStack_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 uStack_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  double dStack_2e8;
  ChMatrixNM<double,_6,_6> CStack_2e0;
  ulong local_1c0 [4];
  undefined1 local_1a0 [16];
  undefined8 auStack_190 [6];
  undefined8 auStack_160 [6];
  undefined8 auStack_130 [6];
  undefined8 auStack_100 [6];
  undefined8 auStack_d0 [20];
  
  (**(code **)(*(long *)(this->section_fpmA).
                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 0x150))(&local_428);
  (**(code **)(*(long *)(this->section_fpmB).
                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 0x150))(&local_450);
  uVar50 = (**(code **)(*(long *)(this->section_fpmA).
                                 super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + 0x1a8))();
  uVar32 = (**(code **)(*(long *)(this->section_fpmB).
                                 super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + 0x1a8))();
  auVar44 = vbroadcastsd_avx512f(ZEXT816(0x3ff0000000000000));
  dVar7 = (eta + 1.0) * 0.5;
  dVar8 = (1.0 - eta) * 0.5;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = local_428;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar8;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar7 * local_450;
  auVar36 = vfmadd231sd_fma(auVar51,auVar42,auVar36);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = local_420;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar7 * local_448;
  auVar37 = vfmadd231sd_fma(auVar52,auVar42,auVar37);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = local_418;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar8;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar7 * local_440;
  auVar38 = vfmadd231sd_fma(auVar53,auVar43,auVar38);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = local_410;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar7 * local_438;
  auVar39 = vfmadd231sd_fma(auVar54,auVar43,auVar39);
  uStack_300 = 0;
  uStack_2f8 = 0;
  uStack_2f0 = 0;
  local_340 = 0;
  uStack_338 = 0;
  uStack_330 = 0;
  uStack_328 = 0;
  uStack_318 = 0;
  uStack_310 = 0;
  uStack_308 = 0;
  local_380 = 0;
  uStack_378 = 0;
  uStack_370 = 0;
  uStack_368 = 0;
  uStack_360 = 0;
  uStack_350 = 0;
  uStack_348 = 0;
  local_3c0 = 0;
  uStack_3b8 = 0;
  uStack_3b0 = 0;
  uStack_3a8 = 0;
  uStack_3a0 = 0;
  uStack_398 = 0;
  uStack_388 = 0;
  uStack_3f8 = 0;
  uStack_3f0 = 0;
  uStack_3e8 = 0;
  uStack_3e0 = 0;
  uStack_3d8 = 0;
  uStack_3d0 = 0;
  vscatterqpd_avx512f(ZEXT864(&local_400) + _DAT_0096d3c0,
                      CONCAT71((int7)((ulong)uVar32 >> 8),0x3f) & 0xffffffff,auVar44);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar50;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar7 * extraout_XMM0_Qa;
  auVar40 = vfmadd231sd_fma(auVar41,auVar43,auVar40);
  local_400 = auVar36._0_8_;
  dStack_2e8 = auVar37._0_8_;
  dStack_3c8 = auVar40._0_8_ * dStack_2e8;
  dStack_320 = auVar38._0_8_;
  dStack_390 = auVar40._0_8_ * dStack_320;
  uStack_358 = auVar39._0_8_;
  GetKlawAtPoint(&CStack_2e0,this,eta);
  auVar10._8_8_ = uStack_3f8;
  auVar10._0_8_ = local_400;
  auVar11._8_8_ = uStack_3e8;
  auVar11._0_8_ = uStack_3f0;
  auVar12._8_8_ = uStack_3d8;
  auVar12._0_8_ = uStack_3e0;
  auVar13._8_8_ = dStack_3c8;
  auVar13._0_8_ = uStack_3d0;
  auVar17._8_8_ = uStack_398;
  auVar17._0_8_ = uStack_3a0;
  auVar21._8_8_ = uStack_368;
  auVar21._0_8_ = uStack_370;
  auVar25._8_8_ = uStack_338;
  auVar25._0_8_ = local_340;
  auVar29._8_8_ = uStack_308;
  auVar29._0_8_ = uStack_310;
  auVar15._8_8_ = uStack_3b8;
  auVar15._0_8_ = local_3c0;
  auVar19._8_8_ = uStack_388;
  auVar19._0_8_ = dStack_390;
  auVar23._8_8_ = uStack_358;
  auVar23._0_8_ = uStack_360;
  auVar27._8_8_ = uStack_328;
  auVar27._0_8_ = uStack_330;
  auVar30._8_8_ = uStack_2f8;
  auVar30._0_8_ = uStack_300;
  auVar16._8_8_ = uStack_3a8;
  auVar16._0_8_ = uStack_3b0;
  auVar20._8_8_ = uStack_378;
  auVar20._0_8_ = local_380;
  auVar24._8_8_ = uStack_348;
  auVar24._0_8_ = uStack_350;
  auVar28._8_8_ = uStack_318;
  auVar28._0_8_ = dStack_320;
  auVar31._8_8_ = dStack_2e8;
  auVar31._0_8_ = uStack_2f0;
  pauVar33 = &local_1a0;
  lVar34 = 0;
  do {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = CStack_2e0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[lVar34];
    auVar36 = vmovddup_avx512vl(auVar1);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = CStack_2e0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[lVar34 + 6];
    auVar37 = vmovddup_avx512vl(auVar2);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = CStack_2e0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[lVar34 + 0xc];
    auVar38 = vmovddup_avx512vl(auVar3);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_1c0[lVar34 + -0x12];
    auVar39 = vmovddup_avx512vl(auVar4);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_1c0[lVar34 + -0xc];
    auVar40 = vmovddup_avx512vl(auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_1c0[lVar34 + -6];
    auVar41 = vmovddup_avx512vl(auVar6);
    lVar34 = lVar34 + 1;
    auVar42 = vmulpd_avx512vl(auVar10,auVar36);
    auVar43 = vmulpd_avx512vl(auVar11,auVar36);
    auVar36 = vmulpd_avx512vl(auVar12,auVar36);
    auVar42 = vfmadd231pd_avx512vl(auVar42,auVar13,auVar37);
    auVar43 = vfmadd231pd_avx512vl(auVar43,auVar15,auVar37);
    auVar36 = vfmadd231pd_avx512vl(auVar36,auVar16,auVar37);
    auVar37 = vfmadd231pd_avx512vl(auVar42,auVar17,auVar38);
    auVar42 = vfmadd231pd_avx512vl(auVar43,auVar19,auVar38);
    auVar36 = vfmadd231pd_avx512vl(auVar36,auVar20,auVar38);
    auVar37 = vfmadd231pd_avx512vl(auVar37,auVar21,auVar39);
    auVar38 = vfmadd231pd_avx512vl(auVar42,auVar23,auVar39);
    auVar36 = vfmadd231pd_avx512vl(auVar36,auVar24,auVar39);
    auVar37 = vfmadd231pd_avx512vl(auVar37,auVar25,auVar40);
    auVar38 = vfmadd231pd_avx512vl(auVar38,auVar27,auVar40);
    auVar36 = vfmadd231pd_avx512vl(auVar36,auVar28,auVar40);
    auVar37 = vfmadd231pd_avx512vl(auVar37,auVar29,auVar41);
    auVar38 = vfmadd231pd_avx512vl(auVar38,auVar30,auVar41);
    auVar36 = vfmadd231pd_avx512vl(auVar36,auVar31,auVar41);
    pauVar33[-2] = auVar37;
    pauVar33[-1] = auVar38;
    *pauVar33 = auVar36;
    pauVar33 = pauVar33 + 3;
  } while (lVar34 != 6);
  auVar44._8_8_ = uStack_3f8;
  auVar44._0_8_ = local_400;
  auVar44._16_8_ = uStack_3f0;
  auVar44._24_8_ = uStack_3e8;
  auVar44._32_8_ = uStack_3e0;
  auVar44._40_8_ = uStack_3d8;
  auVar44._48_8_ = uStack_3d0;
  auVar44._56_8_ = dStack_3c8;
  auVar14._8_8_ = dStack_3c8;
  auVar14._0_8_ = uStack_3d0;
  auVar14._16_8_ = local_3c0;
  auVar14._24_8_ = uStack_3b8;
  auVar14._32_8_ = uStack_3b0;
  auVar14._40_8_ = uStack_3a8;
  auVar14._48_8_ = uStack_3a0;
  auVar14._56_8_ = uStack_398;
  auVar18._8_8_ = uStack_398;
  auVar18._0_8_ = uStack_3a0;
  auVar18._16_8_ = dStack_390;
  auVar18._24_8_ = uStack_388;
  auVar18._32_8_ = local_380;
  auVar18._40_8_ = uStack_378;
  auVar18._48_8_ = uStack_370;
  auVar18._56_8_ = uStack_368;
  auVar22._8_8_ = uStack_368;
  auVar22._0_8_ = uStack_370;
  auVar22._16_8_ = uStack_360;
  auVar22._24_8_ = uStack_358;
  auVar22._32_8_ = uStack_350;
  auVar22._40_8_ = uStack_348;
  auVar22._48_8_ = local_340;
  auVar22._56_8_ = uStack_338;
  auVar26._8_8_ = uStack_338;
  auVar26._0_8_ = local_340;
  auVar26._16_8_ = uStack_330;
  auVar26._24_8_ = uStack_328;
  auVar26._32_8_ = dStack_320;
  auVar26._40_8_ = uStack_318;
  auVar26._48_8_ = uStack_310;
  auVar26._56_8_ = uStack_308;
  lVar34 = 0;
  pdVar35 = (double *)__return_storage_ptr__;
  do {
    uVar32 = auStack_190[lVar34];
    auVar45._8_8_ = uVar32;
    auVar45._0_8_ = uVar32;
    auVar45._16_8_ = uVar32;
    auVar45._24_8_ = uVar32;
    auVar45._32_8_ = uVar32;
    auVar45._40_8_ = uVar32;
    auVar45._48_8_ = uVar32;
    auVar45._56_8_ = uVar32;
    auVar45 = vmulpd_avx512f(auVar14,auVar45);
    uVar32 = auStack_160[lVar34];
    auVar46._8_8_ = uVar32;
    auVar46._0_8_ = uVar32;
    auVar46._16_8_ = uVar32;
    auVar46._24_8_ = uVar32;
    auVar46._32_8_ = uVar32;
    auVar46._40_8_ = uVar32;
    auVar46._48_8_ = uVar32;
    auVar46._56_8_ = uVar32;
    auVar46 = vmulpd_avx512f(auVar18,auVar46);
    uVar50 = local_1c0[lVar34];
    auVar47._8_8_ = uVar50;
    auVar47._0_8_ = uVar50;
    auVar47._16_8_ = uVar50;
    auVar47._24_8_ = uVar50;
    auVar47._32_8_ = uVar50;
    auVar47._40_8_ = uVar50;
    auVar47._48_8_ = uVar50;
    auVar47._56_8_ = uVar50;
    auVar47 = vmulpd_avx512f(auVar44,auVar47);
    uVar32 = auStack_100[lVar34];
    auVar48._8_8_ = uVar32;
    auVar48._0_8_ = uVar32;
    auVar48._16_8_ = uVar32;
    auVar48._24_8_ = uVar32;
    auVar48._32_8_ = uVar32;
    auVar48._40_8_ = uVar32;
    auVar48._48_8_ = uVar32;
    auVar48._56_8_ = uVar32;
    auVar48 = vmulpd_avx512f(auVar26,auVar48);
    uVar32 = auStack_d0[lVar34];
    auVar49._8_8_ = uVar32;
    auVar49._0_8_ = uVar32;
    auVar49._16_8_ = uVar32;
    auVar49._24_8_ = uVar32;
    auVar49._32_8_ = uVar32;
    auVar49._40_8_ = uVar32;
    auVar49._48_8_ = uVar32;
    auVar49._56_8_ = uVar32;
    auVar49 = vmulpd_avx512f(ZEXT4864(CONCAT840(dStack_2e8,
                                                CONCAT832(uStack_2f0,
                                                          CONCAT824(uStack_2f8,
                                                                    CONCAT816(uStack_300,
                                                                              CONCAT88(uStack_308,
                                                                                       uStack_310)))
                                                         ))),auVar49);
    auVar45 = vaddpd_avx512f(auVar45,auVar46);
    auVar46 = vaddpd_avx512f(auVar48,auVar49);
    auVar45 = vaddpd_avx512f(auVar47,auVar45);
    uVar32 = auStack_130[lVar34];
    auVar9._8_8_ = uVar32;
    auVar9._0_8_ = uVar32;
    auVar9._16_8_ = uVar32;
    auVar9._24_8_ = uVar32;
    auVar9._32_8_ = uVar32;
    auVar9._40_8_ = uVar32;
    auVar9._48_8_ = uVar32;
    auVar9._56_8_ = uVar32;
    auVar47 = vmulpd_avx512f(auVar22,auVar9);
    lVar34 = lVar34 + 1;
    auVar46 = vaddpd_avx512f(auVar47,auVar46);
    auVar45 = vaddpd_avx512f(auVar45,auVar46);
    *pdVar35 = auVar45._0_8_;
    pdVar35[1] = auVar45._8_8_;
    pdVar35[2] = auVar45._16_8_;
    pdVar35[3] = auVar45._24_8_;
    pdVar35[4] = auVar45._32_8_;
    pdVar35[5] = auVar45._40_8_;
    pdVar35[6] = pdVar35[6];
    pdVar35[7] = pdVar35[7];
    pdVar35 = pdVar35 + 6;
  } while (lVar34 != 6);
  return __return_storage_ptr__;
}

Assistant:

ChMatrixNM<double, 6, 6> ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM::GetRlawAtPoint(const double eta) {
    DampingCoefficients rdamping_coeff_A = this->section_fpmA->GetBeamRaleyghDamping();
    DampingCoefficients rdamping_coeff_B = this->section_fpmB->GetBeamRaleyghDamping();
    double artificial_factor_for_shear_damping_A = this->section_fpmA->GetArtificialFactorForShearDamping();
    double artificial_factor_for_shear_damping_B = this->section_fpmB->GetArtificialFactorForShearDamping();

    // linear interpolation
    double Nx1 = (1. / 2.) * (1 - eta);
    double Nx2 = (1. / 2.) * (1 + eta);
    double mbx = Nx1 * rdamping_coeff_A.bx + Nx2 * rdamping_coeff_B.bx;
    double mby = Nx1 * rdamping_coeff_A.by + Nx2 * rdamping_coeff_B.by;
    double mbz = Nx1 * rdamping_coeff_A.bz + Nx2 * rdamping_coeff_B.bz;
    double mbt = Nx1 * rdamping_coeff_A.bt + Nx2 * rdamping_coeff_B.bt;
    double artificial_factor_for_shear_damping =
        Nx1 * artificial_factor_for_shear_damping_A + Nx2 * artificial_factor_for_shear_damping_B;

    ChMatrixNM<double, 6, 6> mb;
    mb.setIdentity();
    mb(0, 0) = mbx;
    mb(1, 1) = mby * artificial_factor_for_shear_damping;
    mb(2, 2) = mbz * artificial_factor_for_shear_damping;
    mb(3, 3) = mbt;
    mb(4, 4) = mbz;
    mb(5, 5) = mby;

    ChMatrixNM<double, 6, 6> Klaw_point = this->GetKlawAtPoint(eta);
    ChMatrixNM<double, 6, 6> Rlaw_point = mb.transpose() * Klaw_point * mb;  // material damping matrix

    return Rlaw_point;
}